

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O1

void nn_parse_options(nn_commandline *cline,void *target,int argc,char **argv)

{
  long *plVar1;
  bool bVar2;
  char **ppcVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  nn_option *pnVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  uint opt_index;
  ulong uVar12;
  int iVar13;
  size_t __size;
  nn_option *pnVar14;
  nn_option *pnVar15;
  nn_option *pnVar16;
  nn_parse_context ctx;
  nn_parse_context local_88;
  
  pnVar14 = cline->options;
  local_88.requires = (unsigned_long)cline->required_options;
  __size = 0xffffffffffffffff;
  pnVar7 = pnVar14;
  do {
    __size = __size + 1;
    ppcVar3 = &pnVar7->longname;
    pnVar7 = pnVar7 + 1;
  } while (*ppcVar3 != (char *)0x0);
  local_88.def = cline;
  local_88.options = pnVar14;
  local_88.target = target;
  local_88.argc = argc;
  local_88.argv = argv;
  local_88.last_option_usage = (char **)calloc(8,__size);
  if (local_88.last_option_usage == (char **)0x0) {
LAB_001047d6:
    nn_parse_options_cold_3();
LAB_001047de:
    fprintf((FILE *)argv,"%s: Unknown option ``%s\'\'\n");
LAB_00104767:
    exit(1);
  }
  local_88.mask = 0;
  local_88.args_left = argc + -1;
  pnVar7 = (nn_option *)*argv;
  local_88.arg = argv;
  pcVar8 = strrchr((char *)pnVar7,0x2f);
  pnVar16 = (nn_option *)(pcVar8 + 1);
  if (pcVar8 == (char *)0x0) {
    pnVar16 = pnVar7;
  }
  argv = (char **)_stderr;
  pnVar15 = local_88.options;
  ppcVar3 = local_88.arg;
  if (pnVar14->longname != (char *)0x0) {
    lVar11 = 0x58;
    pnVar7 = (nn_option *)0x0;
    do {
      if ((pnVar14->arg0name != (char *)0x0) &&
         (iVar5 = strcmp((char *)pnVar16,pnVar14->arg0name), iVar5 == 0)) {
        iVar5 = nn_has_arg(pnVar14);
        if (iVar5 != 0) goto LAB_0010479d;
        local_88.last_option_usage[(long)pnVar7] = *local_88.argv;
        nn_process_option(&local_88,(int)pnVar7,(char *)0x0);
      }
      pnVar7 = (nn_option *)((long)&pnVar7->longname + 1);
      pnVar14 = (nn_option *)((long)&(local_88.options)->longname + lVar11);
      plVar1 = (long *)((long)&(local_88.options)->longname + lVar11);
      lVar11 = lVar11 + 0x58;
      argv = (char **)_stderr;
      pnVar15 = local_88.options;
      ppcVar3 = local_88.arg;
    } while (*plVar1 != 0);
  }
joined_r0x001044ae:
  do {
    _stderr = (FILE *)argv;
    local_88.options = pnVar15;
    if (local_88.args_left == 0) {
      local_88.arg = ppcVar3;
      nn_check_requires(&local_88);
      free(local_88.last_option_usage);
      return;
    }
    local_88.args_left = local_88.args_left + -1;
    local_88.arg = ppcVar3 + 1;
    pcVar8 = ppcVar3[1];
    local_88.data = pcVar8;
    if (*pcVar8 != '-') {
LAB_00104790:
      nn_parse_options_cold_1();
LAB_0010479d:
      __assert_fail("!nn_has_arg (opt)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tools/options.c"
                    ,0x220,"void nn_parse_arg0(struct nn_parse_context *)");
    }
    cVar4 = pcVar8[1];
    if (cVar4 == '-') {
      ppcVar3 = local_88.arg;
      if (pcVar8[2] != '\0') {
        pcVar10 = pnVar15->longname;
        if (pcVar10 == (char *)0x0) {
          opt_index = 0xffffffff;
          iVar5 = 0;
        }
        else {
          uVar9 = 0;
          uVar12 = 0xffffffff;
          iVar5 = 0;
          do {
            for (lVar11 = 0; (cVar4 = pcVar8[lVar11 + 2], cVar4 != '=' && (cVar4 != '\0'));
                lVar11 = lVar11 + 1) {
              if (cVar4 != pcVar10[lVar11]) goto LAB_00104554;
            }
            iVar6 = (int)lVar11;
            if (pcVar10[lVar11] == '\0') {
              opt_index = (uint)uVar9;
              iVar5 = iVar6;
              break;
            }
            if (iVar5 == iVar6) {
              uVar12 = 0xffffffff;
            }
            else {
              iVar13 = iVar6;
              if (iVar6 < iVar5) {
                iVar13 = iVar5;
              }
              bVar2 = iVar5 < iVar6;
              iVar5 = iVar13;
              if (bVar2) {
                uVar12 = uVar9 & 0xffffffff;
              }
            }
LAB_00104554:
            opt_index = (uint)uVar12;
            uVar9 = uVar9 + 1;
            pcVar10 = pnVar15[uVar9].longname;
          } while (pcVar10 != (char *)0x0);
        }
        if ((int)opt_index < 0) {
          if (0 < iVar5) {
            fprintf((FILE *)argv,"%s: Ambiguous option ``%s\'\':\n",*local_88.argv,pcVar8);
            pcVar10 = pnVar15->longname;
            while (pcVar10 != (char *)0x0) {
              for (lVar11 = 0; (cVar4 = pcVar8[lVar11 + 2], cVar4 != '=' && (cVar4 != '\0'));
                  lVar11 = lVar11 + 1) {
                if (cVar4 != pcVar10[lVar11]) goto LAB_00104759;
              }
              fprintf(_stderr,"    %s\n");
LAB_00104759:
              pnVar7 = pnVar15 + 1;
              pnVar15 = pnVar15 + 1;
              pcVar10 = pnVar7->longname;
            }
            goto LAB_00104767;
          }
          goto LAB_001047de;
        }
        pnVar7 = pnVar15 + opt_index;
        local_88.last_option_usage[opt_index] = pcVar8;
        cVar4 = pcVar8[(long)iVar5 + 2];
        argv = (char **)CONCAT71((int7)((ulong)pcVar8 >> 8),cVar4);
        iVar6 = nn_has_arg(pnVar7);
        if (cVar4 == '=') {
          if (iVar6 == 0) {
            pcVar8 = "does not accept argument";
LAB_001047cc:
            nn_option_error(pcVar8,&local_88,opt_index);
            goto LAB_001047d6;
          }
          pcVar8 = pcVar8 + (long)iVar5 + 3;
        }
        else {
          if (iVar6 != 0) {
            if (local_88.args_left == 0) {
              pcVar8 = "requires an argument";
              goto LAB_001047cc;
            }
            local_88.args_left = local_88.args_left + -1;
            local_88.data = local_88.arg[1];
            local_88.arg = local_88.arg + 1;
            nn_process_option(&local_88,opt_index,local_88.data);
            argv = (char **)_stderr;
            pnVar15 = local_88.options;
            ppcVar3 = local_88.arg;
            goto joined_r0x001044ae;
          }
          pcVar8 = (char *)0x0;
        }
        nn_process_option(&local_88,opt_index,pcVar8);
        argv = (char **)_stderr;
        pnVar15 = local_88.options;
        ppcVar3 = local_88.arg;
      }
      goto joined_r0x001044ae;
    }
    local_88.data = pcVar8 + 1;
    while (argv = (char **)_stderr, pnVar15 = local_88.options, ppcVar3 = local_88.arg,
          cVar4 != '\0') {
      if ((local_88.options)->longname == (char *)0x0) {
LAB_00104771:
        nn_parse_options_cold_2();
LAB_0010477e:
        nn_option_error("requires an argument",&local_88,(int)pnVar7);
        goto LAB_00104790;
      }
      pnVar7 = (nn_option *)0x0;
      pnVar14 = local_88.options;
      while (pnVar14->shortname != cVar4) {
        pnVar7 = (nn_option *)((long)&pnVar7->longname + 1);
        pnVar16 = pnVar14 + 1;
        pnVar14 = pnVar14 + 1;
        if (pnVar16->longname == (char *)0x0) goto LAB_00104771;
      }
      local_88.last_option_usage[(long)pnVar7] = local_88.data;
      iVar5 = nn_has_arg(pnVar14);
      if (iVar5 == 0) {
        nn_process_option(&local_88,(int)pnVar7,(char *)0x0);
        local_88.data = local_88.data + 1;
      }
      else {
        if (local_88.data[1] == '\0') {
          if (local_88.args_left == 0) goto LAB_0010477e;
          local_88.args_left = local_88.args_left + -1;
          pcVar8 = local_88.arg[1];
          local_88.arg = local_88.arg + 1;
          local_88.data = pcVar8;
        }
        else {
          pcVar8 = local_88.data + 1;
        }
        nn_process_option(&local_88,(int)pnVar7,pcVar8);
        local_88.data = "";
      }
      cVar4 = *local_88.data;
    }
  } while( true );
}

Assistant:

void nn_parse_options (struct nn_commandline *cline,
    void *target, int argc, char **argv)
{
    struct nn_parse_context ctx;
    int num_options;

    ctx.def = cline;
    ctx.options = cline->options;
    ctx.target = target;
    ctx.argc = argc;
    ctx.argv = argv;
    ctx.requires = cline->required_options;

    for (num_options = 0; ctx.options[num_options].longname; ++num_options);
    ctx.last_option_usage = calloc (sizeof (char *), num_options);
    if  (!ctx.last_option_usage)
        nn_memory_error (&ctx);

    ctx.mask = 0;
    ctx.args_left = argc - 1;
    ctx.arg = argv;

    nn_parse_arg0 (&ctx);

    while (nn_get_arg (&ctx)) {
        nn_parse_arg (&ctx);
    }

    nn_check_requires (&ctx);

    free (ctx.last_option_usage);

}